

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type __thiscall
QList<QSplitterLayoutStruct_*>::takeFirst(QList<QSplitterLayoutStruct_*> *this)

{
  QSplitterLayoutStruct **ppQVar1;
  QPodArrayOps<QSplitterLayoutStruct_*> *this_00;
  QArrayDataPointer<QSplitterLayoutStruct_*> *in_RDI;
  value_type v;
  QList<QSplitterLayoutStruct_*> *in_stack_fffffffffffffff0;
  QSplitterLayoutStruct *pQVar2;
  
  ppQVar1 = first(in_stack_fffffffffffffff0);
  pQVar2 = *ppQVar1;
  this_00 = (QPodArrayOps<QSplitterLayoutStruct_*> *)
            QArrayDataPointer<QSplitterLayoutStruct_*>::operator->(in_RDI);
  QtPrivate::QPodArrayOps<QSplitterLayoutStruct_*>::eraseFirst(this_00);
  return pQVar2;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }